

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  long lVar2;
  
  if (0 < ntests) {
    ppcVar1 = &tests[0].name;
    lVar2 = 0;
    do {
      puts(*ppcVar1);
      (*((Test *)(ppcVar1 + -1))->fn)();
      lVar2 = lVar2 + 1;
      ppcVar1 = ppcVar1 + 2;
    } while (lVar2 < ntests);
  }
  puts("PASS");
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  for (int i = 0; i < ntests; i++) {
    printf("%s\n", tests[i].name);
    tests[i].fn();
  }
  printf("PASS\n");
  return 0;
}